

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnBlock(SharedValidator *this,Location *loc,Type sig_type)

{
  Result rhs;
  Opcode local_58;
  Enum local_54;
  undefined1 local_50 [8];
  TypeVector result_types;
  TypeVector param_types;
  Location *loc_local;
  SharedValidator *this_local;
  Type sig_type_local;
  Result result;
  
  this_local._0_4_ = sig_type.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_50);
  this->expr_loc_ = loc;
  Opcode::Opcode(&local_58,Block);
  local_54 = (Enum)CheckBlockSignature(this,loc,local_58,this_local._0_4_,
                                       (TypeVector *)
                                       &result_types.
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (TypeVector *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_54);
  rhs = TypeChecker::OnBlock
                  (&this->typechecker_,
                   (TypeVector *)
                   &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,(TypeVector *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_50);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
             &result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnBlock(const Location& loc, Type sig_type) {
  Result result = Result::Ok;
  TypeVector param_types, result_types;
  expr_loc_ = &loc;
  result |= CheckBlockSignature(loc, Opcode::Block, sig_type, &param_types,
                                &result_types);
  result |= typechecker_.OnBlock(param_types, result_types);
  return result;
}